

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

void BrotliDecoderStateCleanupAfterMetablock(BrotliDecoderStateInternal *s)

{
  size_t sVar1;
  
  (*s->free_func)(s->memory_manager_opaque,s->context_modes);
  s->context_modes = (uint8_t *)0x0;
  (*s->free_func)(s->memory_manager_opaque,s->context_map);
  s->context_map = (uint8_t *)0x0;
  (*s->free_func)(s->memory_manager_opaque,s->dist_context_map);
  s->dist_context_map = (uint8_t *)0x0;
  (*s->free_func)(s->memory_manager_opaque,(s->literal_hgroup).htrees);
  (s->literal_hgroup).htrees = (HuffmanCode **)0x0;
  (*s->free_func)(s->memory_manager_opaque,(s->insert_copy_hgroup).htrees);
  (s->insert_copy_hgroup).htrees = (HuffmanCode **)0x0;
  (*s->free_func)(s->memory_manager_opaque,(s->distance_hgroup).htrees);
  (s->distance_hgroup).htrees = (HuffmanCode **)0x0;
  if ((s->field_0x338 & 0x40) != 0) {
    if (s->saved_position_literals_begin != 0) {
      sVar1 = (s->literals_block_splits).num_blocks;
      (s->literals_block_splits).positions_end[sVar1] = s->pos;
      (s->literals_block_splits).num_blocks = sVar1 + 1;
      (s->literals_block_splits).num_types_prev_metablocks = (s->literals_block_splits).num_types;
      s->saved_position_literals_begin = 0;
    }
    if (s->saved_position_lengths_begin != 0) {
      sVar1 = (s->insert_copy_length_block_splits).num_blocks;
      (s->insert_copy_length_block_splits).positions_end[sVar1] = s->pos;
      (s->insert_copy_length_block_splits).num_blocks = sVar1 + 1;
      (s->insert_copy_length_block_splits).num_types_prev_metablocks =
           (s->insert_copy_length_block_splits).num_types;
      s->saved_position_lengths_begin = 0;
    }
  }
  return;
}

Assistant:

void BrotliDecoderStateCleanupAfterMetablock(BrotliDecoderState* s) {
  BROTLI_DECODER_FREE(s, s->context_modes);
  BROTLI_DECODER_FREE(s, s->context_map);
  BROTLI_DECODER_FREE(s, s->dist_context_map);
  BROTLI_DECODER_FREE(s, s->literal_hgroup.htrees);
  BROTLI_DECODER_FREE(s, s->insert_copy_hgroup.htrees);
  BROTLI_DECODER_FREE(s, s->distance_hgroup.htrees);

  /* If needed save the end of a last in metablock block */
  if (s->save_info_for_recompression) {
    /* Save the end only if previously saved a start */
    if (s->saved_position_literals_begin) {
      s->literals_block_splits.positions_end[s->literals_block_splits.num_blocks] = s->pos;
      s->literals_block_splits.num_blocks++;
      s->literals_block_splits.num_types_prev_metablocks = s->literals_block_splits.num_types;
      s->saved_position_literals_begin = BROTLI_FALSE;
    }
    if (s->saved_position_lengths_begin) {
      s->insert_copy_length_block_splits.positions_end[s->insert_copy_length_block_splits.num_blocks] = s->pos;
      s->insert_copy_length_block_splits.num_blocks++;
      s->insert_copy_length_block_splits.num_types_prev_metablocks = s->insert_copy_length_block_splits.num_types;
      s->saved_position_lengths_begin = BROTLI_FALSE;
    }
  }
}